

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CbQueue.h
# Opt level: O3

void __thiscall Hpipe::CbQueue::new_buff(CbQueue *this,PT size)

{
  Buffer *pBVar1;
  Buffer *pBVar2;
  ulong uVar3;
  
  if (this->beg == (Buffer *)0x0) {
    pBVar2 = (Buffer *)malloc(0x804);
    pBVar2->used = 0;
    pBVar2->size = 0x7e8;
    pBVar2->next = (Buffer *)0x0;
    pBVar2->cpt_use = 0;
    this->beg = pBVar2;
    this->end = pBVar2;
    this->off = 0;
  }
  else {
    pBVar2 = this->end;
    uVar3 = size + 7 & 0xfffffffffffffff8;
    pBVar1 = (Buffer *)malloc(uVar3 + 0x1c);
    pBVar1->used = 0;
    pBVar1->size = uVar3;
    pBVar1->next = (Buffer *)0x0;
    pBVar1->cpt_use = 0;
    if (pBVar2 != (Buffer *)0x0) {
      pBVar2->next = pBVar1;
    }
    this->end = pBVar1;
  }
  return;
}

Assistant:

void new_buff( PT size = Buffer::default_size ) { if ( not beg ) init_beg(); else end = Buffer::New( size, end ); }